

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.cpp
# Opt level: O3

void __thiscall SGParser::Generator::NFA::AddLink(NFA *this,NFANode *modify,uint c,NFANode *target)

{
  pointer *pppNVar1;
  iterator __position;
  iterator __position_00;
  NFANode *local_28;
  NFANode *target_local;
  uint c_local;
  
  __position._M_current =
       (modify->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_28 = target;
  target_local._4_4_ = c;
  if (__position._M_current ==
      (modify->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&modify->LinkChar,__position,
               (uint *)((long)&target_local + 4));
  }
  else {
    *__position._M_current = c;
    (modify->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  __position_00._M_current =
       (modify->LinkPtr).
       super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (modify->LinkPtr).
      super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<SGParser::Generator::NFANode*,std::allocator<SGParser::Generator::NFANode*>>::
    _M_realloc_insert<SGParser::Generator::NFANode*const&>
              ((vector<SGParser::Generator::NFANode*,std::allocator<SGParser::Generator::NFANode*>>
                *)&modify->LinkPtr,__position_00,&local_28);
  }
  else {
    *__position_00._M_current = target;
    pppNVar1 = &(modify->LinkPtr).
                super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  return;
}

Assistant:

void    NFA::AddLink(NFANode* modify, unsigned c, NFANode* target) {
    modify->LinkChar.push_back(c);
    modify->LinkPtr.push_back(target);
}